

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O2

void __thiscall Apt::SortTaxiEdges(Apt *this)

{
  pointer puVar1;
  pointer pTVar2;
  ulong local_28;
  
  puVar1 = (this->vecTaxiEdgesIdxHead).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->vecTaxiEdgesIdxHead).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->vecTaxiEdgesIdxHead).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->vecTaxiEdgesIdxHead,
             ((long)(this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x28);
  local_28 = 0;
  while( true ) {
    pTVar2 = (this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x28) <= local_28
       ) break;
    if (pTVar2[local_28].type - RUN_WAY < 2) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->vecTaxiEdgesIdxHead,&local_28);
    }
    local_28 = local_28 + 1;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<Apt::SortTaxiEdges()::_lambda(unsigned_long,unsigned_long)_1_>>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(this->vecTaxiEdgesIdxHead).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(this->vecTaxiEdgesIdxHead).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TwinFan[P]LiveTraffic_Src_LTApt_cpp:627:19)>
              )this);
  return;
}

Assistant:

void SortTaxiEdges ()
    {
        // We add all valid(!) edges to the sort array
        vecTaxiEdgesIdxHead.clear();
        vecTaxiEdgesIdxHead.reserve(vecTaxiEdges.size());
        for (size_t eIdx = 0; eIdx < vecTaxiEdges.size(); ++eIdx)
            if (vecTaxiEdges[eIdx].isValid())
                vecTaxiEdgesIdxHead.push_back(eIdx);
        
        // Now sort the index array by the angle of the linked edge
        std::sort(vecTaxiEdgesIdxHead.begin(),
                  vecTaxiEdgesIdxHead.end(),
                  [&](size_t a, size_t b)
                  { return vecTaxiEdges[a].angle < vecTaxiEdges[b].angle; });
    }